

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicselement.h
# Opt level: O0

void __thiscall
TPZMultiphysicsElement::TPZMultiphysicsElement
          (TPZMultiphysicsElement *this,void **vtt,TPZCompMesh *mesh,TPZGeoEl *ref)

{
  TPZManVector<int,_5> *in_RCX;
  long *in_RSI;
  TPZGeoEl *in_RDI;
  TPZCompMesh *in_stack_ffffffffffffffd0;
  void **in_stack_ffffffffffffffd8;
  
  TPZCompEl::TPZCompEl
            ((TPZCompEl *)in_RCX,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_RDI);
  *(long *)in_RDI = *in_RSI;
  *(long *)((long)&in_RDI->field_0x0 + *(long *)(*(long *)in_RDI + -0x60)) = in_RSI[3];
  std::__cxx11::list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::list
            ((list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *)0x1b3c0aa);
  TPZManVector<int,_5>::TPZManVector(in_RCX,(int64_t)in_stack_ffffffffffffffd8);
  return;
}

Assistant:

TPZMultiphysicsElement(TPZCompMesh &mesh, TPZGeoEl *ref) : TPZCompEl(mesh, ref)
	{
	}